

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O0

shared_ptr<mocker::ir::Reg> __thiscall
mocker::ir::dycLocalReg(ir *this,shared_ptr<mocker::ir::Addr> *addr)

{
  bool bVar1;
  element_type *this_00;
  string *psVar2;
  char *pcVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<mocker::ir::Reg> sVar4;
  undefined1 local_28 [8];
  shared_ptr<mocker::ir::Reg> reg;
  shared_ptr<mocker::ir::Addr> *addr_local;
  
  reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)addr;
  dyc<mocker::ir::Reg,std::shared_ptr<mocker::ir::Addr>const&>((ir *)local_28,addr);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_28);
  if (bVar1) {
    this_00 = std::__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_28);
    psVar2 = Reg::getIdentifier_abi_cxx11_(this_00);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)psVar2);
    if (*pcVar3 != '@') {
      std::shared_ptr<mocker::ir::Reg>::shared_ptr
                ((shared_ptr<mocker::ir::Reg> *)this,(shared_ptr<mocker::ir::Reg> *)local_28);
      goto LAB_0029c014;
    }
  }
  std::shared_ptr<mocker::ir::Reg>::shared_ptr((shared_ptr<mocker::ir::Reg> *)this,(nullptr_t)0x0);
LAB_0029c014:
  std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_28);
  sVar4.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ir::Reg>)
         sVar4.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Reg> dycLocalReg(const std::shared_ptr<Addr> &addr) {
  auto reg = dyc<Reg>(addr);
  if (!reg || reg->getIdentifier()[0] == '@')
    return nullptr;
  return reg;
}